

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-error.c
# Opt level: O2

int run_test_sys_error(void)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_10;
  
  iVar1 = uv_translate_sys_error(1);
  if (iVar1 == -1) {
    iVar1 = uv_translate_sys_error(0x20);
    if (iVar1 == -0x20) {
      iVar1 = uv_translate_sys_error(0x16);
      if (iVar1 == -0x16) {
        iVar1 = uv_translate_sys_error(0xffffffffffffffea);
        if (iVar1 == -0x16) {
          iVar1 = uv_translate_sys_error(0xffffffffffffffde);
          if (iVar1 == -0x22) {
            iVar1 = uv_translate_sys_error(0xfffffffffffffff3);
            if (iVar1 == -0xd) {
              iVar1 = uv_translate_sys_error(0);
              if (iVar1 == 0) {
                return 0;
              }
              pcVar2 = "uv_translate_sys_error(0) == 0";
              uStack_10 = 0x4c;
            }
            else {
              pcVar2 = "uv_translate_sys_error(UV_EACCES) == UV_EACCES";
              uStack_10 = 0x4b;
            }
          }
          else {
            pcVar2 = "uv_translate_sys_error(UV_ERANGE) == UV_ERANGE";
            uStack_10 = 0x4a;
          }
        }
        else {
          pcVar2 = "uv_translate_sys_error(UV_EINVAL) == UV_EINVAL";
          uStack_10 = 0x49;
        }
      }
      else {
        pcVar2 = "uv_translate_sys_error(EINVAL) == UV_EINVAL";
        uStack_10 = 0x47;
      }
    }
    else {
      pcVar2 = "uv_translate_sys_error(EPIPE) == UV_EPIPE";
      uStack_10 = 0x46;
    }
  }
  else {
    pcVar2 = "uv_translate_sys_error(EPERM) == UV_EPERM";
    uStack_10 = 0x45;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-error.c"
          ,uStack_10,pcVar2);
  abort();
}

Assistant:

TEST_IMPL(sys_error) {
#if defined(_WIN32)
  ASSERT(uv_translate_sys_error(ERROR_NOACCESS) == UV_EACCES);
  ASSERT(uv_translate_sys_error(ERROR_ELEVATION_REQUIRED) == UV_EACCES);
  ASSERT(uv_translate_sys_error(WSAEADDRINUSE) == UV_EADDRINUSE);
  ASSERT(uv_translate_sys_error(ERROR_BAD_PIPE) == UV_EPIPE);
#else
  ASSERT(uv_translate_sys_error(EPERM) == UV_EPERM);
  ASSERT(uv_translate_sys_error(EPIPE) == UV_EPIPE);
  ASSERT(uv_translate_sys_error(EINVAL) == UV_EINVAL);
#endif
  ASSERT(uv_translate_sys_error(UV_EINVAL) == UV_EINVAL);
  ASSERT(uv_translate_sys_error(UV_ERANGE) == UV_ERANGE);
  ASSERT(uv_translate_sys_error(UV_EACCES) == UV_EACCES);
  ASSERT(uv_translate_sys_error(0) == 0);

  return 0;
}